

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

void bcd_add_mag(ppc_avr_t *t,ppc_avr_t *a,ppc_avr_t *b,int *invalid,int *overflow)

{
  uint8_t uVar1;
  uint8_t uVar2;
  byte digit;
  uint uVar3;
  int i;
  int n;
  byte bVar4;
  
  uVar3 = 0;
  for (n = 1; n != 0x20; n = n + 1) {
    uVar1 = bcd_get_digit(a,n,invalid);
    uVar2 = bcd_get_digit(b,n,invalid);
    bVar4 = (char)uVar3 + uVar1 + uVar2;
    uVar3 = (uint)(9 < bVar4);
    digit = bVar4 - 10;
    if (9 >= bVar4) {
      digit = bVar4;
    }
    bcd_put_digit(t,digit,n);
  }
  *overflow = uVar3;
  return;
}

Assistant:

static void bcd_add_mag(ppc_avr_t *t, ppc_avr_t *a, ppc_avr_t *b, int *invalid,
                       int *overflow)
{
    int carry = 0;
    int i;
    for (i = 1; i <= 31; i++) {
        uint8_t digit = bcd_get_digit(a, i, invalid) +
                        bcd_get_digit(b, i, invalid) + carry;
        if (digit > 9) {
            carry = 1;
            digit -= 10;
        } else {
            carry = 0;
        }

        bcd_put_digit(t, digit, i);
    }

    *overflow = carry;
}